

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

string * __thiscall
calculator::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Tag *__k;
  iterator iVar1;
  mapped_type *pmVar2;
  allocator<char> local_21;
  
  __k = &this->__tag;
  iVar1 = std::
          _Hashtable<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->tagTable)._M_h,__k);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (*__k == Other) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_21);
    }
  }
  else {
    pmVar2 = std::__detail::
             _Map_base<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<calculator::Tag,_std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<calculator::Tag>,_std::hash<calculator::Tag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->tagTable,__k);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() {
        if (tagTable.find(__tag) != tagTable.end())
            return tagTable[__tag];
        else if (__tag == Tag::Other) {
            return std::string(1, static_cast<char>(__c));
        } else
            return "";
    }